

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractstringserialiser.cpp
# Opt level: O0

QVariant * __thiscall
AbstractStringSerialiserPrivate::loadVariant
          (QVariant *__return_storage_ptr__,AbstractStringSerialiserPrivate *this,int type,
          QString *val)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  longlong lVar5;
  ulonglong uVar6;
  float fVar7;
  QFlags<Qt::ImageConversionFlag> local_114;
  undefined1 local_110 [24];
  QBitmap local_f8;
  ImageConversionFlags local_dc;
  QImage local_d8 [24];
  QPixmap local_c0 [24];
  undefined1 local_a8 [36];
  int local_84;
  QAbstractItemModel *local_80;
  QFlags<QByteArray::Base64Option> local_64;
  QByteArray local_60;
  QByteArray local_48;
  char16_t local_2a;
  QString *local_28;
  QString *val_local;
  AbstractStringSerialiserPrivate *pAStack_18;
  int type_local;
  AbstractStringSerialiserPrivate *this_local;
  
  local_28 = val;
  val_local._4_4_ = type;
  pAStack_18 = this;
  this_local = (AbstractStringSerialiserPrivate *)__return_storage_ptr__;
  bVar2 = QString::isEmpty(val);
  if (bVar2) {
    ::QVariant::QVariant(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  if (val_local._4_4_ == 0) {
    ::QVariant::QVariant(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  if (val_local._4_4_ == 1) {
    iVar3 = QString::toInt(local_28,(bool *)0x0,10);
    ::QVariant::QVariant(__return_storage_ptr__,iVar3 == 1);
    return __return_storage_ptr__;
  }
  if (val_local._4_4_ != 2) {
    if (val_local._4_4_ == 3) {
LAB_0012e02e:
      uVar4 = QString::toUInt(local_28,(bool *)0x0,10);
      ::QVariant::QVariant(__return_storage_ptr__,uVar4);
      return __return_storage_ptr__;
    }
    if (val_local._4_4_ == 4) {
      lVar5 = QString::toLongLong((bool *)local_28,0);
      ::QVariant::QVariant(__return_storage_ptr__,lVar5);
      return __return_storage_ptr__;
    }
    if (val_local._4_4_ == 5) {
      uVar6 = QString::toULongLong((bool *)local_28,0);
      ::QVariant::QVariant(__return_storage_ptr__,uVar6);
      return __return_storage_ptr__;
    }
    if (val_local._4_4_ == 6) {
      dVar1 = (double)QString::toDouble((bool *)local_28);
      ::QVariant::QVariant(__return_storage_ptr__,dVar1);
      return __return_storage_ptr__;
    }
    if (val_local._4_4_ == 7) {
      local_2a = (char16_t)QString::at(local_28,0);
      ::QVariant::QVariant(__return_storage_ptr__,(QChar *)(ulong)(ushort)local_2a);
      return __return_storage_ptr__;
    }
    if (val_local._4_4_ == 10) {
      ::QVariant::QVariant(__return_storage_ptr__,(QString *)local_28);
      return __return_storage_ptr__;
    }
    if (val_local._4_4_ == 0xc) {
      QString::toLatin1(&local_60,local_28);
      QFlags<QByteArray::Base64Option>::QFlags(&local_64,Base64Encoding);
      QByteArray::fromBase64((QByteArray *)&local_48,(QFlags_conflict1 *)&local_60);
      ::QVariant::QVariant(__return_storage_ptr__,(QByteArray *)&local_48);
      QByteArray::~QByteArray(&local_48);
      QByteArray::~QByteArray(&local_60);
      return __return_storage_ptr__;
    }
    if (val_local._4_4_ == 0xe) {
      local_80 = (QAbstractItemModel *)QDate::fromString(local_28,ISODate);
      ::QVariant::QVariant(__return_storage_ptr__,(QDate)local_80);
      return __return_storage_ptr__;
    }
    if (val_local._4_4_ == 0xf) {
      local_84 = (int)QTime::fromString(local_28,ISODate);
      ::QVariant::QVariant(__return_storage_ptr__,(QTime)local_84);
      return __return_storage_ptr__;
    }
    if (val_local._4_4_ == 0x10) {
      QDateTime::fromString((QDateTime *)(local_a8 + 0x18),local_28,ISODate);
      ::QVariant::QVariant(__return_storage_ptr__,(QDateTime *)(local_a8 + 0x18));
      QDateTime::~QDateTime((QDateTime *)(local_a8 + 0x18));
      return __return_storage_ptr__;
    }
    if (val_local._4_4_ != 0x20) {
      if (val_local._4_4_ == 0x21) {
        iVar3 = QString::toInt(local_28,(bool *)0x0,10);
        ::QVariant::QVariant(__return_storage_ptr__,(int)(short)iVar3);
        return __return_storage_ptr__;
      }
      if (val_local._4_4_ != 0x22) {
        if (val_local._4_4_ == 0x23) goto LAB_0012e02e;
        if (val_local._4_4_ == 0x24) {
          uVar4 = QString::toUInt(local_28,(bool *)0x0,10);
          ::QVariant::QVariant(__return_storage_ptr__,uVar4 & 0xffff);
          return __return_storage_ptr__;
        }
        if (val_local._4_4_ == 0x25) {
          uVar4 = QString::toUInt(local_28,(bool *)0x0,10);
          ::QVariant::QVariant(__return_storage_ptr__,uVar4 & 0xff);
          return __return_storage_ptr__;
        }
        if (val_local._4_4_ == 0x26) {
          fVar7 = (float)QString::toFloat((bool *)local_28);
          ::QVariant::QVariant(__return_storage_ptr__,fVar7);
          return __return_storage_ptr__;
        }
        if (val_local._4_4_ != 0x28) {
          if (val_local._4_4_ == 0x1001) {
            loadImageVariant((AbstractStringSerialiserPrivate *)local_d8,0x1001,local_28);
            QFlags<Qt::ImageConversionFlag>::QFlags(&local_dc,AutoColor);
            QPixmap::fromImage(local_c0,local_d8,local_dc);
            QPixmap::operator_cast_to_QVariant((QPixmap *)__return_storage_ptr__);
            QPixmap::~QPixmap(local_c0);
            QImage::~QImage(local_d8);
            return __return_storage_ptr__;
          }
          if (val_local._4_4_ != 0x1006) {
            if (val_local._4_4_ != 0x1009) {
              stringToVariant(__return_storage_ptr__,this,local_28);
              return __return_storage_ptr__;
            }
            loadImageVariant((AbstractStringSerialiserPrivate *)local_110,0x1009,local_28);
            QFlags<Qt::ImageConversionFlag>::QFlags(&local_114,AutoColor);
            QBitmap::fromImage((QImage *)(local_110 + 0x18),(QFlags_conflict1 *)local_110);
            QBitmap::operator_cast_to_QVariant((QBitmap *)__return_storage_ptr__);
            QBitmap::~QBitmap((QBitmap *)(local_110 + 0x18));
            QImage::~QImage((QImage *)local_110);
            return __return_storage_ptr__;
          }
          loadImageVariant((AbstractStringSerialiserPrivate *)local_a8,0x1006,local_28);
          QImage::operator_cast_to_QVariant((QImage *)__return_storage_ptr__);
          QImage::~QImage((QImage *)local_a8);
          return __return_storage_ptr__;
        }
      }
      iVar3 = QString::toInt(local_28,(bool *)0x0,10);
      ::QVariant::QVariant(__return_storage_ptr__,(int)(char)iVar3);
      return __return_storage_ptr__;
    }
  }
  iVar3 = QString::toInt(local_28,(bool *)0x0,10);
  ::QVariant::QVariant(__return_storage_ptr__,iVar3);
  return __return_storage_ptr__;
}

Assistant:

QVariant AbstractStringSerialiserPrivate::loadVariant(int type, const QString &val) const
{
    if (val.isEmpty())
        return QVariant();
    switch (type) {
    case QMetaType::UnknownType:
        Q_ASSERT_X(false, "ModelSerialisation::loadVariant", "Trying to load unregistered type.");
        return QVariant();
    case QMetaType::Bool:
        return val.toInt() == 1;
    case QMetaType::Long:
    case QMetaType::Int:
        return val.toInt();
    case QMetaType::ULong:
    case QMetaType::UInt:
        return val.toUInt();
    case QMetaType::LongLong:
        return val.toLongLong();
    case QMetaType::ULongLong:
        return val.toULongLong();
    case QMetaType::Double:
        return val.toDouble();
    case QMetaType::Short:
        return static_cast<short>(val.toInt());
    case QMetaType::SChar:
    case QMetaType::Char:
        return static_cast<char>(val.toInt());
    case QMetaType::UShort:
        return static_cast<unsigned short>(val.toUInt());
    case QMetaType::UChar:
        return static_cast<unsigned char>(val.toUInt());
    case QMetaType::Float:
        return val.toFloat();
    case QMetaType::QChar:
        return val.at(0);
    case QMetaType::QString:
        return val;
    case QMetaType::QByteArray:
        return QByteArray::fromBase64(val.toLatin1());
    case QMetaType::QDate:
        return QDate::fromString(val, Qt::ISODate);
    case QMetaType::QTime:
        return QTime::fromString(val, Qt::ISODate);
    case QMetaType::QDateTime:
        return QDateTime::fromString(val, Qt::ISODate);
#ifdef QT_GUI_LIB
    case QMetaType::QImage:
        return loadImageVariant(type, val);
    case QMetaType::QPixmap:
        return QPixmap::fromImage(loadImageVariant(type, val));
    case QMetaType::QBitmap:
        return QBitmap::fromImage(loadImageVariant(type, val));
#endif
    default:
        return stringToVariant(val);
    }
}